

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  bool bVar1;
  const_reference this_00;
  ulong uVar2;
  allocator<char> *in_RDI;
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  undefined1 in_stack_00000247;
  SectionNode *in_stack_00000248;
  string *in_stack_00000250;
  string *in_stack_00000258;
  JunitReporter *in_stack_00000260;
  undefined7 in_stack_fffffffffffffeb0;
  char in_stack_fffffffffffffeb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  StringRef *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *in_stack_fffffffffffffef8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  StringRef local_80 [2];
  string local_60 [32];
  string local_40 [32];
  SectionNode *local_20;
  
  this_00 = std::
            vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::front((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                     *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  local_20 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  StringRef::operator_cast_to_string(in_stack_fffffffffffffee8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    (anonymous_namespace)::fileNameTag_abi_cxx11_(in_stack_fffffffffffffef8);
    std::__cxx11::string::operator=(local_40,local_60);
    std::__cxx11::string::~string(local_60);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::operator=(local_40,"global");
    }
  }
  local_80[0] = (StringRef)(**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
  bVar1 = StringRef::empty(local_80);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))();
    StringRef::operator_cast_to_string(in_stack_fffffffffffffee8);
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb7);
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    std::__cxx11::string::operator=(local_40,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
  }
  anon_unknown_26::normalizeNamespaceMarkers
            ((string *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,in_RDI);
  TestCaseInfo::okToFail
            ((TestCaseInfo *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  writeSection(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
               (bool)in_stack_00000247);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void JunitReporter::writeTestCase( TestCaseNode const& testCaseNode ) {
        TestCaseStats const& stats = testCaseNode.value;

        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert( testCaseNode.children.size() == 1 );
        SectionNode const& rootSection = *testCaseNode.children.front();

        std::string className =
            static_cast<std::string>( stats.testInfo->className );

        if( className.empty() ) {
            className = fileNameTag(stats.testInfo->tags);
            if ( className.empty() ) {
                className = "global";
            }
        }

        if ( !m_config->name().empty() )
            className = static_cast<std::string>(m_config->name()) + '.' + className;

        normalizeNamespaceMarkers(className);

        writeSection( className, "", rootSection, stats.testInfo->okToFail() );
    }